

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateRegressorInterface
                   (Result *__return_storage_ptr__,ModelDescription *description,int modelVersion)

{
  string *features;
  bool bVar1;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  allocator_type local_69;
  undefined1 local_68 [24];
  undefined1 local_50 [40];
  TypeCase local_28 [2];
  
  bVar1 = std::operator==((description->predictedfeaturename_).ptr_,"");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)local_50,"Specification is missing regressor predictedFeatureName.",
               (allocator *)local_68);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    validateFeatureDescriptions(__return_storage_ptr__,description,modelVersion);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      features = (description->predictedfeaturename_).ptr_;
      local_28[0] = kDoubleType;
      local_28[1] = kMultiArrayType;
      __l._M_len = 2;
      __l._M_array = local_28;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_68,__l,&local_69);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_50,(CoreML *)&description->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)features,
                 (string *)local_68,in_R8);
      Result::operator=(__return_storage_ptr__,(Result *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)local_68);
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateRegressorInterface(const Specification::ModelDescription& description, int modelVersion) {
        
        if (description.predictedfeaturename() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing regressor predictedFeatureName.");
        }
        
        // Validate feature descriptions
        Result result = validateFeatureDescriptions(description, modelVersion);
        if (!result.good()) {
            return result;
        }

        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   description.predictedfeaturename(),
                                                                   {Specification::FeatureType::kDoubleType, Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        return result;
    }